

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ClassType::populate(ClassType *this,Scope *scope,ClassDeclarationSyntax *syntax)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  bool bVar1;
  SymbolIndex SVar2;
  reference ppMVar3;
  SyntaxNode *in_RDX;
  uint uVar4;
  undefined8 in_RSI;
  Symbol *in_RDI;
  SyntaxNode *in_stack_000000a8;
  Scope *in_stack_000000b0;
  VariableSymbol *tv;
  optional<slang::ast::MethodBuilder> constraint_mode;
  optional<slang::ast::MethodBuilder> rand_mode;
  optional<slang::ast::MethodBuilder> srandom;
  optional<slang::ast::MethodBuilder> set_randstate;
  anon_class_40_5_ecee1c2a makeFunc;
  SymbolMap *scopeNameMap;
  anon_class_1_0_00000001 checkOverride;
  Type *string_t;
  Type *int_t;
  Type *void_t;
  Compilation *comp;
  MemberSyntax *member;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  Symbol *last;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  undefined2 in_stack_fffffffffffffa50;
  undefined2 uVar5;
  MethodFlags in_stack_fffffffffffffa52;
  VariableFlags r;
  VariableFlags in_stack_fffffffffffffa54;
  undefined2 in_stack_fffffffffffffa56;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *in_stack_fffffffffffffa58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa60;
  VariableLifetime *in_stack_fffffffffffffa68;
  MethodBuilder *in_stack_fffffffffffffa70;
  Type *in_stack_fffffffffffffa78;
  undefined8 in_stack_fffffffffffffa80;
  ArgumentDirection direction;
  Type *this_00;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  undefined4 uVar6;
  MethodBuilder *in_stack_fffffffffffffa90;
  MethodBuilder *in_stack_fffffffffffffa98;
  Type *in_stack_fffffffffffffaa0;
  bitmask<slang::ast::VariableFlags> local_4d6;
  undefined4 local_4d4;
  VariableSymbol *local_4d0;
  VariableLifetime local_4c8 [11];
  bitmask<slang::ast::MethodFlags> local_49a [32];
  undefined1 in_stack_fffffffffffffba7;
  Type *in_stack_fffffffffffffba8;
  anon_class_40_5_ecee1c2a *in_stack_fffffffffffffbb0;
  bitmask<slang::ast::MethodFlags> in_stack_fffffffffffffbbe;
  string_view in_stack_fffffffffffffbc0;
  undefined1 local_430 [198];
  bitmask<slang::ast::MethodFlags> local_36a [41];
  SubroutineKind in_stack_fffffffffffffce8;
  bitmask<slang::ast::MethodFlags> local_2c2 [56];
  bitmask<slang::ast::MethodFlags> local_252 [56];
  bitmask<slang::ast::MethodFlags> local_1e2 [56];
  bitmask<slang::ast::MethodFlags> local_172 [56];
  underlying_type local_102;
  SymbolMap *local_98;
  undefined1 *local_90;
  undefined8 local_88;
  Compilation *local_80;
  SymbolMap *local_70;
  undefined1 local_61;
  Type *local_60;
  Type *local_58;
  Type *local_50;
  Compilation *local_48;
  MemberSyntax *local_40;
  MemberSyntax **local_38;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  local_30;
  SyntaxNode **local_28;
  Symbol *local_20;
  SyntaxNode *local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = Scope::getLastMember((Scope *)&in_RDI[1].name);
  if (local_20 == (Symbol *)0x0) {
    *(undefined4 *)&in_RDI[3].field_0x34 = 1;
  }
  else {
    SVar2 = Symbol::getIndex(local_20);
    SVar2 = ast::operator+(SVar2,1);
    *(SymbolIndex *)&in_RDI[3].field_0x34 = SVar2;
  }
  if (*(short *)&local_18[3].parent == 0x145) {
    *(undefined1 *)&in_RDI[2].name._M_str = 1;
  }
  else if (*(short *)&local_18[3].parent == 200) {
    *(undefined1 *)((long)&in_RDI[2].name._M_str + 1) = 1;
  }
  if ((local_18[4].previewNode != (SyntaxNode *)0x0) &&
     (*(short *)&local_18[4].previewNode[1].previewNode == 0xa8)) {
    *(undefined1 *)((long)&in_RDI[2].name._M_str + 2) = 1;
  }
  Symbol::setSyntax(in_RDI,local_18);
  local_28 = &local_18[7].parent;
  local_30._M_current =
       (MemberSyntax **)
       std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
                  CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  local_38 = (MemberSyntax **)
             std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                       (in_stack_fffffffffffffa58);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)CONCAT26(in_stack_fffffffffffffa56,
                                   CONCAT24(in_stack_fffffffffffffa54,
                                            CONCAT22(in_stack_fffffffffffffa52,
                                                     in_stack_fffffffffffffa50))),
                       (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    direction = (ArgumentDirection)((ulong)in_stack_fffffffffffffa80 >> 0x20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppMVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_30);
    local_40 = *ppMVar3;
    Scope::addMembers(in_stack_000000b0,in_stack_000000a8);
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  local_48 = Scope::getCompilation((Scope *)&in_RDI[1].name);
  local_50 = Compilation::getVoidType(local_48);
  local_58 = Compilation::getIntType(local_48);
  local_60 = Compilation::getStringType(local_48);
  local_61 = 0;
  local_98 = Scope::getUnelaboratedNameMap((Scope *)&in_RDI[1].name);
  local_90 = &local_61;
  local_88 = local_10;
  local_80 = local_48;
  local_70 = local_98;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58);
  local_102 = (underlying_type)ast::operator|(in_stack_fffffffffffffa54,in_stack_fffffffffffffa52);
  populate::anon_class_40_5_ecee1c2a::operator()
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffbc0,in_stack_fffffffffffffba8,
             (bool)in_stack_fffffffffffffba7,in_stack_fffffffffffffbbe,in_stack_fffffffffffffce8);
  std::optional<slang::ast::MethodBuilder>::~optional
            ((optional<slang::ast::MethodBuilder> *)0x3f4e22);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58);
  bitmask<slang::ast::MethodFlags>::bitmask(local_172,None);
  populate::anon_class_40_5_ecee1c2a::operator()
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffbc0,in_stack_fffffffffffffba8,
             (bool)in_stack_fffffffffffffba7,in_stack_fffffffffffffbbe,in_stack_fffffffffffffce8);
  std::optional<slang::ast::MethodBuilder>::~optional
            ((optional<slang::ast::MethodBuilder> *)0x3f4eaa);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58);
  bitmask<slang::ast::MethodFlags>::bitmask(local_1e2,None);
  populate::anon_class_40_5_ecee1c2a::operator()
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffbc0,in_stack_fffffffffffffba8,
             (bool)in_stack_fffffffffffffba7,in_stack_fffffffffffffbbe,in_stack_fffffffffffffce8);
  std::optional<slang::ast::MethodBuilder>::~optional
            ((optional<slang::ast::MethodBuilder> *)0x3f4f32);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58);
  bitmask<slang::ast::MethodFlags>::bitmask(local_252,None);
  populate::anon_class_40_5_ecee1c2a::operator()
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffbc0,in_stack_fffffffffffffba8,
             (bool)in_stack_fffffffffffffba7,in_stack_fffffffffffffbbe,in_stack_fffffffffffffce8);
  std::optional<slang::ast::MethodBuilder>::~optional
            ((optional<slang::ast::MethodBuilder> *)0x3f4fb5);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58);
  bitmask<slang::ast::MethodFlags>::bitmask(local_2c2,None);
  populate::anon_class_40_5_ecee1c2a::operator()
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffbc0,in_stack_fffffffffffffba8,
             (bool)in_stack_fffffffffffffba7,in_stack_fffffffffffffbbe,in_stack_fffffffffffffce8);
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::MethodBuilder> *)0x3f5038);
  if (bVar1) {
    std::optional<slang::ast::MethodBuilder>::operator->
              ((optional<slang::ast::MethodBuilder> *)0x3f504e);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58);
    std::optional<slang::SVInt>::optional((optional<slang::SVInt> *)0x3f508f);
    name._M_str = (char *)in_stack_fffffffffffffaa0;
    name._M_len = (size_t)in_stack_fffffffffffffa98;
    MethodBuilder::addArg
              (in_stack_fffffffffffffa90,name,
               (Type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),direction,
               (optional<slang::SVInt> *)in_stack_fffffffffffffa78);
    std::optional<slang::SVInt>::~optional((optional<slang::SVInt> *)0x3f50ce);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58);
  bitmask<slang::ast::MethodFlags>::bitmask(local_36a,None);
  populate::anon_class_40_5_ecee1c2a::operator()
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffbc0,in_stack_fffffffffffffba8,
             (bool)in_stack_fffffffffffffba7,in_stack_fffffffffffffbbe,in_stack_fffffffffffffce8);
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::MethodBuilder> *)0x3f5188);
  if (bVar1) {
    std::optional<slang::ast::MethodBuilder>::operator->
              ((optional<slang::ast::MethodBuilder> *)0x3f519e);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58);
    std::optional<slang::SVInt>::optional((optional<slang::SVInt> *)0x3f51d9);
    name_00._M_str = (char *)in_stack_fffffffffffffaa0;
    name_00._M_len = (size_t)in_stack_fffffffffffffa98;
    MethodBuilder::addArg
              (in_stack_fffffffffffffa90,name_00,
               (Type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),direction,
               (optional<slang::SVInt> *)in_stack_fffffffffffffa78);
    std::optional<slang::SVInt>::~optional((optional<slang::SVInt> *)0x3f5212);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58);
  bitmask<slang::ast::MethodFlags>::bitmask
            ((bitmask<slang::ast::MethodFlags> *)(local_430 + 0x2e),None);
  populate::anon_class_40_5_ecee1c2a::operator()
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffbc0,in_stack_fffffffffffffba8,
             (bool)in_stack_fffffffffffffba7,in_stack_fffffffffffffbbe,in_stack_fffffffffffffce8);
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::MethodBuilder> *)0x3f52d9);
  if (bVar1) {
    in_stack_fffffffffffffa98 =
         std::optional<slang::ast::MethodBuilder>::operator->
                   ((optional<slang::ast::MethodBuilder> *)0x3f52ef);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58);
    in_stack_fffffffffffffaa0 = Compilation::getBitType(local_48);
    in_stack_fffffffffffffa90 = (MethodBuilder *)local_430;
    std::optional<slang::SVInt>::optional((optional<slang::SVInt> *)0x3f532e);
    name_01._M_str = (char *)in_stack_fffffffffffffaa0;
    name_01._M_len = (size_t)in_stack_fffffffffffffa98;
    MethodBuilder::addArg
              (in_stack_fffffffffffffa90,name_01,
               (Type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),direction,
               (optional<slang::SVInt> *)in_stack_fffffffffffffa78);
    std::optional<slang::SVInt>::~optional((optional<slang::SVInt> *)0x3f5364);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58);
  uVar6 = 0;
  this_00 = local_50;
  bitmask<slang::ast::MethodFlags>::bitmask(local_49a,None);
  uVar4 = (uint)local_49a[0].m_bits;
  uVar5 = 0;
  r = None;
  populate::anon_class_40_5_ecee1c2a::operator()
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffbc0,in_stack_fffffffffffffba8,
             (bool)in_stack_fffffffffffffba7,in_stack_fffffffffffffbbe,in_stack_fffffffffffffce8);
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::MethodBuilder> *)0x3f5444);
  if (bVar1) {
    in_stack_fffffffffffffa70 =
         std::optional<slang::ast::MethodBuilder>::operator->
                   ((optional<slang::ast::MethodBuilder> *)0x3f545a);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58);
    in_stack_fffffffffffffa78 = Compilation::getBitType(local_48);
    in_stack_fffffffffffffa68 = local_4c8;
    std::optional<slang::SVInt>::optional((optional<slang::SVInt> *)0x3f5499);
    name_02._M_str = (char *)in_stack_fffffffffffffaa0;
    name_02._M_len = (size_t)in_stack_fffffffffffffa98;
    MethodBuilder::addArg
              (in_stack_fffffffffffffa90,name_02,(Type *)CONCAT44(uVar6,in_stack_fffffffffffffa88),
               (ArgumentDirection)((ulong)this_00 >> 0x20),
               (optional<slang::SVInt> *)in_stack_fffffffffffffa78);
    std::optional<slang::SVInt>::~optional((optional<slang::SVInt> *)0x3f54cf);
  }
  local_4d4 = 0;
  local_4d0 = BumpAllocator::
              emplace<slang::ast::VariableSymbol,char_const(&)[5],slang::SourceLocation&,slang::ast::VariableLifetime>
                        ((BumpAllocator *)this_00,(char (*) [5])in_stack_fffffffffffffa78,
                         (SourceLocation *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  ValueSymbol::setType
            ((ValueSymbol *)
             CONCAT26(in_stack_fffffffffffffa56,
                      CONCAT24(in_stack_fffffffffffffa54,CONCAT22(r,uVar5))),
             (Type *)CONCAT44(in_stack_fffffffffffffa4c,uVar4));
  local_4d6 = ast::operator|(in_stack_fffffffffffffa54,r);
  bitmask<slang::ast::VariableFlags>::operator|=(&local_4d0->flags,&local_4d6);
  Symbol::setParent((Symbol *)local_4d0,(Scope *)&in_RDI[1].name);
  in_RDI[2].name._M_len = (size_t)local_4d0;
  if ((*(long *)(local_18 + 6) != 0) || (local_18[6].parent != (SyntaxNode *)0x0)) {
    Scope::setNeedElaboration((Scope *)0x3f5608);
  }
  std::optional<slang::ast::MethodBuilder>::~optional
            ((optional<slang::ast::MethodBuilder> *)0x3f5619);
  std::optional<slang::ast::MethodBuilder>::~optional
            ((optional<slang::ast::MethodBuilder> *)0x3f5626);
  std::optional<slang::ast::MethodBuilder>::~optional
            ((optional<slang::ast::MethodBuilder> *)0x3f5633);
  std::optional<slang::ast::MethodBuilder>::~optional
            ((optional<slang::ast::MethodBuilder> *)0x3f5640);
  return;
}

Assistant:

void ClassType::populate(const Scope& scope, const ClassDeclarationSyntax& syntax) {
    // Save the current member index -- for generic classes, this is the location that
    // can see all parameter members but nothing else. This is needed to correctly
    // resolve type parameters used in extends and implements clauses.
    if (auto last = getLastMember())
        headerIndex = last->getIndex() + 1;
    else
        headerIndex = SymbolIndex(1);

    if (syntax.virtualOrInterface.kind == TokenKind::VirtualKeyword)
        isAbstract = true;
    else if (syntax.virtualOrInterface.kind == TokenKind::InterfaceKeyword)
        isInterface = true;

    if (syntax.finalSpecifier && syntax.finalSpecifier->keyword.kind == TokenKind::FinalKeyword)
        isFinal = true;

    setSyntax(syntax);
    for (auto member : syntax.items)
        addMembers(*member);

    // All class types get some built-in methods.
    auto& comp = getCompilation();
    auto& void_t = comp.getVoidType();
    auto& int_t = comp.getIntType();
    auto& string_t = comp.getStringType();

    auto checkOverride = [](auto& s) {
        return s.subroutineKind == SubroutineKind::Function && s.getArguments().empty() &&
               s.getReturnType().isVoid() && s.visibility == Visibility::Public &&
               s.flags == MethodFlags::None;
    };

    auto& scopeNameMap = getUnelaboratedNameMap();
    auto makeFunc = [&](std::string_view funcName, const Type& returnType, bool allowOverride,
                        bitmask<MethodFlags> extraFlags = MethodFlags::None,
                        SubroutineKind subroutineKind =
                            SubroutineKind::Function) -> std::optional<MethodBuilder> {
        if (auto it = scopeNameMap.find(funcName); it != scopeNameMap.end()) {
            auto existing = it->second;
            if (allowOverride) {
                bool ok = false;
                if (existing->kind == SymbolKind::Subroutine)
                    ok = checkOverride(existing->as<SubroutineSymbol>());
                else if (existing->kind == SymbolKind::MethodPrototype)
                    ok = checkOverride(existing->as<MethodPrototypeSymbol>());

                if (!ok)
                    scope.addDiag(diag::InvalidRandomizeOverride, existing->location) << funcName;
            }
            else {
                scope.addDiag(diag::InvalidMethodOverride, existing->location) << funcName;
            }
            return {};
        }

        MethodBuilder builder(comp, funcName, returnType, subroutineKind);
        builder.addFlags(extraFlags);
        addMember(builder.symbol);
        return builder;
    };

    makeFunc("randomize", int_t, false, MethodFlags::Virtual | MethodFlags::Randomize);
    makeFunc("pre_randomize", void_t, true);
    makeFunc("post_randomize", void_t, true);
    makeFunc("get_randstate", string_t, false);

    auto set_randstate = makeFunc("set_randstate", void_t, false);
    if (set_randstate)
        set_randstate->addArg("state", string_t);

    auto srandom = makeFunc("srandom", void_t, false);
    if (srandom)
        srandom->addArg("seed", int_t);

    auto rand_mode = makeFunc("rand_mode", void_t, false, MethodFlags::None,
                              SubroutineKind::Function);
    if (rand_mode)
        rand_mode->addArg("on_ff", comp.getBitType());

    auto constraint_mode = makeFunc("constraint_mode", void_t, false, MethodFlags::None,
                                    SubroutineKind::Function);
    if (constraint_mode)
        constraint_mode->addArg("on_ff", comp.getBitType());

    // Give this class a "thisVar" that can be used by non-static class
    // property initializers to refer to their own instance.
    auto tv = comp.emplace<VariableSymbol>("this", location, VariableLifetime::Automatic);
    tv->setType(*this);
    tv->flags |= VariableFlags::Const | VariableFlags::CompilerGenerated;
    tv->setParent(*this);
    thisVar = tv;

    // This needs to happen last, otherwise setting "needs elaboration" before
    // trying to access the name map can cause infinite recursion.
    if (syntax.extendsClause || syntax.implementsClause)
        setNeedElaboration();
}